

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O2

void cuddZddSymmSummary(DdManager *table,int lower,int upper,int *symvars,int *symgroups)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  iVar4 = 0;
  for (; lower <= upper; lower = lower + 1) {
    uVar1 = lower;
    if (table->subtableZ[lower].next != lower) {
      do {
        uVar2 = uVar1;
        iVar3 = iVar3 + 1;
        uVar1 = table->subtableZ[(int)uVar2].next;
      } while (uVar1 != lower);
      iVar4 = iVar4 + 1;
      lower = uVar2;
    }
  }
  *symvars = iVar3;
  *symgroups = iVar4;
  return;
}

Assistant:

static void
cuddZddSymmSummary(
  DdManager * table,
  int  lower,
  int  upper,
  int * symvars,
  int * symgroups)
{
    int i,x,gbot;
    int TotalSymm = 0;
    int TotalSymmGroups = 0;

    for (i = lower; i <= upper; i++) {
        if (table->subtableZ[i].next != (unsigned) i) {
            TotalSymmGroups++;
            x = i;
            do {
                TotalSymm++;
                gbot = x;
                x = table->subtableZ[x].next;
            } while (x != i);
#ifdef DD_DEBUG
            assert(table->subtableZ[gbot].next == (unsigned) i);
#endif
            i = gbot;
        }
    }
    *symvars = TotalSymm;
    *symgroups = TotalSymmGroups;

    return;

}